

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

idx_t duckdb::WindowBoundariesState::FindNextStart(ValidityMask *mask,idx_t l,idx_t r,idx_t *n)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar4 = *n;
  if (puVar1 == (unsigned_long *)0x0) {
    uVar2 = (l + uVar4) - 1;
    if (r <= uVar2) {
      uVar2 = r;
    }
    iVar3 = 0;
    if (r - l <= uVar4) {
      iVar3 = uVar4 - (r - l);
    }
    *n = iVar3;
    return uVar2;
  }
  do {
    while( true ) {
      if (r <= l) {
        return r;
      }
      uVar5 = (ulong)((uint)l & 0x3f);
      uVar2 = puVar1[l >> 6];
      if (uVar2 != 0 || uVar5 != 0) break;
      l = l + 0x40;
    }
    for (; (uVar5 < 0x40 && (l < r)); l = l + 1) {
      if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
        uVar4 = uVar4 - 1;
        *n = uVar4;
        if (uVar4 == 0) {
          return l;
        }
      }
      uVar5 = uVar5 + 1;
    }
  } while( true );
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}